

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  int iVar6;
  bool bVar7;
  byte bVar8;
  stbi_uc *retval_from_stbi_load;
  int iVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  stbi_uc sVar14;
  uint uVar15;
  int y;
  int x;
  int n;
  uint8_vec buf;
  uint local_54;
  uint local_50;
  int local_4c;
  vector<unsigned_char> local_48;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_2c;
  
  local_48.m_p = (stbi_uc *)0x0;
  local_48.m_size = 0;
  local_48.m_capacity = 0;
  bVar7 = data_stream::read_array(serializer->m_pStream,&local_48);
  bVar10 = false;
  if (bVar7) {
    local_50 = 0;
    local_54 = 0;
    local_4c = 0;
    retval_from_stbi_load =
         stbi_load_from_memory
                   (local_48.m_p,local_48.m_size,(int *)&local_50,(int *)&local_54,&local_4c,4);
    iVar6 = local_4c;
    if (retval_from_stbi_load != (stbi_uc *)0x0) {
      if ((int)local_54 < 0x4001 && (int)local_50 < 0x4001) {
        local_2c.m_u32 = 0xff000000;
        image<crnlib::color_quad<unsigned_char,_int>_>::resize
                  (img,local_50,local_54,0xffffffff,
                   (color_quad<unsigned_char,_int> *)&local_2c.field_0);
        if ((int)local_54 < 1) {
          uVar15 = 0x1f;
        }
        else {
          bVar8 = 1;
          iVar9 = 0;
          do {
            if ((long)(int)local_50 != 0) {
              uVar11 = (ulong)(img->m_pitch * iVar9);
              pcVar5 = img->m_pPixels;
              iVar12 = local_50 * iVar9;
              lVar13 = 0;
              do {
                sVar14 = retval_from_stbi_load[lVar13 + (long)iVar12 * 4 + 3];
                if ((iVar6 != 2) && (iVar6 != 4)) {
                  sVar14 = 0xff;
                }
                psVar1 = pcVar5[uVar11].field_0.c + lVar13;
                sVar2 = retval_from_stbi_load[lVar13 + (long)iVar12 * 4];
                sVar3 = retval_from_stbi_load[lVar13 + (long)iVar12 * 4 + 1];
                sVar4 = retval_from_stbi_load[lVar13 + (long)iVar12 * 4 + 2];
                *psVar1 = sVar2;
                psVar1[1] = sVar3;
                bVar8 = bVar8 & (sVar3 == sVar4 && sVar2 == sVar3);
                psVar1[2] = sVar4;
                psVar1[3] = sVar14;
                lVar13 = lVar13 + 4;
              } while ((color_quad<unsigned_char,_int> *)(psVar1 + 4) !=
                       pcVar5 + uVar11 + (long)(int)local_50);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 < (int)local_54);
          uVar15 = (uint)bVar8 << 4 | 0xf;
        }
        stbi_image_free(retval_from_stbi_load);
        img->m_comp_flags = uVar15;
        if ((iVar6 != 2) && (iVar6 != 4)) {
          uVar15 = uVar15 & 0xfffffff7;
        }
        img->m_comp_flags = uVar15;
        bVar10 = true;
        goto LAB_00119bfb;
      }
      stbi_image_free(retval_from_stbi_load);
    }
    bVar10 = false;
  }
LAB_00119bfb:
  if (local_48.m_p != (stbi_uc *)0x0) {
    crnlib_free(local_48.m_p);
  }
  return bVar10;
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img) {
  uint8_vec buf;
  if (!serializer.read_entire_file(buf))
    return false;

  int x = 0, y = 0, n = 0;
  unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

  if (!pData)
    return false;

  if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION)) {
    stbi_image_free(pData);
    return false;
  }

  const bool has_alpha = ((n == 2) || (n == 4));

  img.resize(x, y);

  bool grayscale = true;

  for (int py = 0; py < y; py++) {
    const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
    color_quad_u8* pDst = img.get_scanline(py);
    color_quad_u8* pDst_end = pDst + x;

    while (pDst != pDst_end) {
      color_quad_u8 c(*pSrc++);
      if (!has_alpha)
        c.a = 255;

      if (!c.is_grayscale())
        grayscale = false;

      *pDst++ = c;
    }
  }

  stbi_image_free(pData);

  img.reset_comp_flags();
  img.set_grayscale(grayscale);
  img.set_component_valid(3, has_alpha);

  return true;
}